

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O3

SparseMatrix<double,_0,_int> * __thiscall
Eigen::SparseMatrix<double,0,int>::operator=
          (SparseMatrix<double,0,int> *this,
          SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_> *other)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  StorageIndex *pSVar5;
  StorageIndex *pSVar6;
  Index IVar7;
  Index IVar8;
  StorageIndex *pSVar9;
  Scalar *pSVar10;
  Index IVar11;
  Index IVar12;
  SparseMatrix<double,_0,_int> *pSVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  void *__ptr;
  undefined8 *puVar17;
  Index j;
  ulong uVar18;
  ulong uVar19;
  Index size;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  SparseMatrix<double,_0,_int> local_88;
  SparseMatrix<double,_0,_int> *local_40;
  long local_38;
  
  lVar1 = *(long *)(other + 8);
  local_88.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)false;
  local_88.m_outerSize = 0;
  local_88.m_innerSize = 0;
  local_88.m_outerIndex = (StorageIndex *)0x0;
  local_88.m_innerNonZeros = (StorageIndex *)0x0;
  local_88.m_data.m_values = (Scalar *)0x0;
  local_88.m_data.m_indices = (StorageIndex *)0x0;
  local_88.m_data.m_size = 0;
  local_88.m_data.m_allocatedSize = 0;
  SparseMatrix<double,_0,_int>::resize(&local_88,*(Index *)(lVar1 + 8),*(Index *)(lVar1 + 0x10));
  pSVar5 = local_88.m_outerIndex;
  IVar7 = local_88.m_outerSize;
  uVar18 = local_88.m_outerSize;
  if ((((ulong)local_88.m_outerIndex & 3) == 0) &&
     (uVar18 = (ulong)(-((uint)((ulong)local_88.m_outerIndex >> 2) & 0x3fffffff) & 3),
     local_88.m_outerSize <= (long)uVar18)) {
    uVar18 = local_88.m_outerSize;
  }
  uVar24 = local_88.m_outerSize - uVar18;
  uVar19 = uVar24 + 3;
  if (-1 < (long)uVar24) {
    uVar19 = uVar24;
  }
  local_40 = (SparseMatrix<double,_0,_int> *)this;
  local_38 = lVar1;
  if (0 < (long)uVar18) {
    memset(local_88.m_outerIndex,0,uVar18 * 4);
  }
  lVar1 = (uVar19 & 0xfffffffffffffffc) + uVar18;
  if (3 < (long)uVar24) {
    lVar16 = uVar18 + 4;
    if ((long)(uVar18 + 4) < lVar1) {
      lVar16 = lVar1;
    }
    memset(pSVar5 + uVar18,0,(~uVar18 + lVar16 & 0xfffffffffffffffc) * 4 + 0x10);
  }
  if (lVar1 < IVar7) {
    memset(pSVar5 + ((long)uVar19 >> 2) * 4 + uVar18,0,((long)uVar24 % 4) * 4);
  }
  lVar16 = local_38;
  IVar7 = local_88.m_outerSize;
  lVar1 = *(long *)(local_38 + 8);
  if (0 < lVar1) {
    lVar2 = *(long *)(local_38 + 0x30);
    lVar3 = *(long *)(local_38 + 0x18);
    lVar4 = *(long *)(local_38 + 0x20);
    lVar20 = 0;
    do {
      lVar21 = (long)*(int *)(lVar3 + lVar20 * 4);
      if (lVar4 == 0) {
        lVar22 = (long)*(int *)(lVar3 + 4 + lVar20 * 4);
      }
      else {
        lVar22 = *(int *)(lVar4 + lVar20 * 4) + lVar21;
      }
      if (lVar21 < lVar22) {
        do {
          local_88.m_outerIndex[*(int *)(lVar2 + lVar21 * 4)] =
               local_88.m_outerIndex[*(int *)(lVar2 + lVar21 * 4)] + 1;
          lVar21 = lVar21 + 1;
        } while (lVar22 != lVar21);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != lVar1);
  }
  if (local_88.m_outerSize == 0) {
    __ptr = (void *)0x0;
    iVar15 = 0;
  }
  else {
    if (((ulong)local_88.m_outerSize >> 0x3e != 0) ||
       (__ptr = malloc(local_88.m_outerSize * 4), __ptr == (void *)0x0)) {
      puVar17 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar17 = std::streambuf::xsgetn;
      __cxa_throw(puVar17,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    uVar18 = 0;
    iVar14 = 0;
    do {
      iVar15 = local_88.m_outerIndex[uVar18] + iVar14;
      local_88.m_outerIndex[uVar18] = iVar14;
      *(int *)((long)__ptr + uVar18 * 4) = iVar14;
      uVar18 = uVar18 + 1;
      iVar14 = iVar15;
    } while (IVar7 != uVar18);
  }
  local_88.m_outerIndex[IVar7] = iVar15;
  internal::CompressedStorage<double,_int>::resize(&local_88.m_data,(long)iVar15,0.0);
  pSVar13 = local_40;
  lVar1 = *(long *)(lVar16 + 8);
  if (0 < lVar1) {
    lVar2 = *(long *)(lVar16 + 0x28);
    lVar3 = *(long *)(lVar16 + 0x30);
    lVar4 = *(long *)(lVar16 + 0x18);
    lVar16 = *(long *)(lVar16 + 0x20);
    lVar20 = 0;
    do {
      lVar21 = (long)*(int *)(lVar4 + lVar20 * 4);
      if (lVar16 == 0) {
        lVar22 = (long)*(int *)(lVar4 + 4 + lVar20 * 4);
      }
      else {
        lVar22 = *(int *)(lVar16 + lVar20 * 4) + lVar21;
      }
      if (lVar21 < lVar22) {
        do {
          lVar23 = (long)*(int *)(lVar3 + lVar21 * 4);
          iVar14 = *(int *)((long)__ptr + lVar23 * 4);
          *(int *)((long)__ptr + lVar23 * 4) = iVar14 + 1;
          local_88.m_data.m_indices[iVar14] = (StorageIndex)lVar20;
          local_88.m_data.m_values[iVar14] = *(Scalar *)(lVar2 + lVar21 * 8);
          lVar21 = lVar21 + 1;
        } while (lVar22 != lVar21);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != lVar1);
  }
  pSVar5 = local_40->m_outerIndex;
  IVar7 = local_40->m_outerSize;
  IVar8 = local_40->m_innerSize;
  local_40->m_outerSize = local_88.m_outerSize;
  local_40->m_innerSize = local_88.m_innerSize;
  pSVar9 = local_40->m_innerNonZeros;
  pSVar10 = (local_40->m_data).m_values;
  local_40->m_outerIndex = local_88.m_outerIndex;
  local_40->m_innerNonZeros = local_88.m_innerNonZeros;
  (local_40->m_data).m_values = local_88.m_data.m_values;
  pSVar6 = (local_40->m_data).m_indices;
  (local_40->m_data).m_indices = local_88.m_data.m_indices;
  IVar11 = (local_40->m_data).m_size;
  IVar12 = (local_40->m_data).m_allocatedSize;
  (local_40->m_data).m_size = local_88.m_data.m_size;
  (local_40->m_data).m_allocatedSize = local_88.m_data.m_allocatedSize;
  local_88.m_outerSize = IVar7;
  local_88.m_innerSize = IVar8;
  local_88.m_outerIndex = pSVar5;
  local_88.m_innerNonZeros = pSVar9;
  local_88.m_data.m_values = pSVar10;
  local_88.m_data.m_indices = pSVar6;
  local_88.m_data.m_size = IVar11;
  local_88.m_data.m_allocatedSize = IVar12;
  free(__ptr);
  free(pSVar5);
  free(local_88.m_innerNonZeros);
  internal::CompressedStorage<double,_int>::~CompressedStorage(&local_88.m_data);
  return pSVar13;
}

Assistant:

EIGEN_DONT_INLINE SparseMatrix<Scalar,_Options,_StorageIndex>& SparseMatrix<Scalar,_Options,_StorageIndex>::operator=(const SparseMatrixBase<OtherDerived>& other)
{
  EIGEN_STATIC_ASSERT((internal::is_same<Scalar, typename OtherDerived::Scalar>::value),
        YOU_MIXED_DIFFERENT_NUMERIC_TYPES__YOU_NEED_TO_USE_THE_CAST_METHOD_OF_MATRIXBASE_TO_CAST_NUMERIC_TYPES_EXPLICITLY)

  #ifdef EIGEN_SPARSE_CREATE_TEMPORARY_PLUGIN
    EIGEN_SPARSE_CREATE_TEMPORARY_PLUGIN
  #endif
      
  const bool needToTranspose = (Flags & RowMajorBit) != (internal::evaluator<OtherDerived>::Flags & RowMajorBit);
  if (needToTranspose)
  {
    #ifdef EIGEN_SPARSE_TRANSPOSED_COPY_PLUGIN
      EIGEN_SPARSE_TRANSPOSED_COPY_PLUGIN
    #endif
    // two passes algorithm:
    //  1 - compute the number of coeffs per dest inner vector
    //  2 - do the actual copy/eval
    // Since each coeff of the rhs has to be evaluated twice, let's evaluate it if needed
    typedef typename internal::nested_eval<OtherDerived,2,typename internal::plain_matrix_type<OtherDerived>::type >::type OtherCopy;
    typedef typename internal::remove_all<OtherCopy>::type _OtherCopy;
    typedef internal::evaluator<_OtherCopy> OtherCopyEval;
    OtherCopy otherCopy(other.derived());
    OtherCopyEval otherCopyEval(otherCopy);

    SparseMatrix dest(other.rows(),other.cols());
    Eigen::Map<IndexVector> (dest.m_outerIndex,dest.outerSize()).setZero();

    // pass 1
    // FIXME the above copy could be merged with that pass
    for (Index j=0; j<otherCopy.outerSize(); ++j)
      for (typename OtherCopyEval::InnerIterator it(otherCopyEval, j); it; ++it)
        ++dest.m_outerIndex[it.index()];

    // prefix sum
    StorageIndex count = 0;
    IndexVector positions(dest.outerSize());
    for (Index j=0; j<dest.outerSize(); ++j)
    {
      StorageIndex tmp = dest.m_outerIndex[j];
      dest.m_outerIndex[j] = count;
      positions[j] = count;
      count += tmp;
    }
    dest.m_outerIndex[dest.outerSize()] = count;
    // alloc
    dest.m_data.resize(count);
    // pass 2
    for (StorageIndex j=0; j<otherCopy.outerSize(); ++j)
    {
      for (typename OtherCopyEval::InnerIterator it(otherCopyEval, j); it; ++it)
      {
        Index pos = positions[it.index()]++;
        dest.m_data.index(pos) = j;
        dest.m_data.value(pos) = it.value();
      }
    }
    this->swap(dest);
    return *this;
  }
  else
  {
    if(other.isRValue())
    {
      initAssignment(other.derived());
    }
    // there is no special optimization
    return Base::operator=(other.derived());
  }
}